

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

MemChunk * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize)

{
  ulong uVar1;
  FixedArena *pFVar2;
  MemSegment *pMVar3;
  MemSegment *pMVar4;
  MemChunk *pMVar5;
  ulong uVar6;
  
  if (((chunkSize < 0xffffffffffffffe8) &&
      (((this->m_footprintLimit == 0 ||
        (uVar1 = this->m_footprint + chunkSize + 0x18,
        uVar1 <= this->m_footprintLimit && this->m_footprint < uVar1)) &&
       (pFVar2 = this->m_arena, pFVar2->m_used == false)))) &&
     (uVar1 = pFVar2->m_size, chunkSize + 0x18 <= uVar1)) {
    pFVar2->m_used = true;
    pMVar3 = (MemSegment *)pFVar2->m_page;
    if (pMVar3 != (MemSegment *)0x0) {
      uVar6 = this->m_footprint + uVar1;
      this->m_footprint = uVar6;
      if (this->m_maxFootprint < uVar6) {
        this->m_maxFootprint = uVar6;
      }
      pMVar3->m_size = uVar1;
      pMVar3->m_pad = 1;
      pMVar3[1].m_size = uVar1 - 0x18;
      *(ulong *)((long)pMVar3 + (uVar1 - 8)) = uVar1 - 0x18;
      pMVar4 = this->m_segList;
      if (pMVar4 == (MemSegment *)0x0) {
        this->m_release_checks = 0xfff;
      }
      this->m_segList = pMVar3;
      pMVar3->m_next = pMVar4;
      pMVar5 = splitChunk(this,(MemChunk *)&pMVar3->m_pad,chunkSize);
      return pMVar5;
    }
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }